

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

char * rtmidi_get_port_name(RtMidiPtr device,uint portNumber)

{
  char *pcVar1;
  string name;
  char *local_30 [4];
  
  (**(code **)(*device->ptr + 0x18))(local_30,device->ptr,portNumber);
  pcVar1 = strdup(local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return pcVar1;
}

Assistant:

const char* rtmidi_get_port_name (RtMidiPtr device, unsigned int portNumber)
{
    try {
        std::string name = ((RtMidi*) device->ptr)->getPortName (portNumber);
        return strdup (name.c_str ());

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        return "";
    }
}